

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirINCBIN(void)

{
  bool bVar1;
  int iVar2;
  fullpath_ref_t file;
  aint length;
  aint offset;
  char *message;
  aint val;
  aint local_1c;
  
  file = GetInputFile(&lp);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      lp = lp + -1;
      offset = 0;
LAB_0010e11c:
      bVar1 = anyComma(&lp);
      length = 0x7fffffff;
      if ((!bVar1) ||
         (iVar2 = ParseExpressionNoSyntaxError(&lp,&local_1c), length = local_1c, iVar2 != 0))
      goto LAB_0010e14a;
      message = "[INCBIN] Syntax error in <length>";
    }
    else {
      iVar2 = ParseExpressionNoSyntaxError(&lp,&local_1c);
      offset = local_1c;
      if (iVar2 != 0) goto LAB_0010e11c;
      message = "[INCBIN] Syntax error in <offset>";
    }
    Error(message,bp,SUPPRESS);
  }
  else {
    offset = 0;
    length = 0x7fffffff;
LAB_0010e14a:
    BinIncFile(file,offset,length);
  }
  return;
}

Assistant:

static void dirINCBIN() {
	int offset = 0, length = INT_MAX;
	fullpath_ref_t fnaam = GetInputFile(lp);
	if (anyComma(lp)) {
		aint val;
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <offset>", bp, SUPPRESS);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCBIN] Syntax error in <length>", bp, SUPPRESS);
				return;
			}
			length = val;
		}
	}
	BinIncFile(fnaam, offset, length);
}